

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_base.h
# Opt level: O1

void __thiscall
async::detail::task_base::add_continuation<async::detail::inline_scheduler_impl>
          (task_base *this,inline_scheduler_impl *sched,task_ptr *cont)

{
  bool bVar1;
  
  if (1 < (byte)((this->state)._M_i - completed)) {
    bVar1 = continuation_vector::try_add(&this->continuations,cont);
    if (bVar1) {
      return;
    }
  }
  run_continuation<async::detail::inline_scheduler_impl>(this,sched,cont);
  return;
}

Assistant:

void add_continuation(Sched& sched, task_ptr cont)
	{
		// Check for task completion
		task_state current_state = state.load(std::memory_order_relaxed);
		if (!is_finished(current_state)) {
			// Try to add the task to the continuation list. This can fail only
			// if the task has just finished, in which case we run it directly.
			if (continuations.try_add(std::move(cont)))
				return;
		}

		// Otherwise run the continuation directly
		std::atomic_thread_fence(std::memory_order_acquire);
		run_continuation(sched, std::move(cont));
	}